

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O1

void free_multiple_field(uint len,void *arg,char ***orig)

{
  char **ppcVar1;
  char *__ptr;
  ulong uVar2;
  
  if (arg != (void *)0x0) {
    if (len != 0) {
      uVar2 = 0;
      do {
        ppcVar1 = *orig;
        __ptr = ppcVar1[uVar2];
        if (__ptr != (char *)0x0) {
          free(__ptr);
          ppcVar1[uVar2] = (char *)0x0;
        }
        uVar2 = uVar2 + 1;
      } while (len != uVar2);
    }
    free(arg);
    free(*orig);
    *orig = (char **)0x0;
  }
  return;
}

Assistant:

static void
free_multiple_field(unsigned int len, void *arg, char ***orig)
{
  unsigned int i;
  if (arg) {
    for (i = 0; i < len; ++i)
      {
        free_string_field(&((*orig)[i]));
      }

    free (arg);
    free (*orig);
    *orig = 0;
  }
}